

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O1

void jrotate(double *A,int N,double a,double b,int i)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  if ((a != 0.0) || (NAN(a))) {
    dVar5 = a * a + b * b;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = a / dVar5;
    dVar5 = b / dVar5;
  }
  else {
    dVar5 = signx(b);
    dVar6 = 0.0;
  }
  if (i < N) {
    lVar3 = (long)i;
    iVar4 = i * N;
    do {
      dVar1 = A[iVar4 + lVar3];
      dVar2 = A[(iVar4 + N) + lVar3];
      A[iVar4 + lVar3] = dVar6 * dVar1 + dVar2 * -dVar5;
      A[(iVar4 + N) + lVar3] = dVar1 * dVar5 + dVar2 * dVar6;
      lVar3 = lVar3 + 1;
    } while (N != lVar3);
  }
  return;
}

Assistant:

static void jrotate(double *A,int N,double a,double b,int i) {
	int j,r,r1;
	double c,s,den,y,w;
	r = i * N;
	r1 = r + N;
	if (a == 0.0) {
		c = 0.0;
		s = signx(b);
	} else {
		den = sqrt(a*a+b*b);
		c = a / den;
		s = b / den;
	}
	
	for (j = i; j < N;++j) {
		y = A[r+j];
		w = A[r1+j];
		A[r+j] = c*y - s*w;
		A[r1+j] = s*y + c*w;
	}
}